

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NDOLoader.cpp
# Opt level: O2

bool __thiscall
Assimp::NDOImporter::CanRead(NDOImporter *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  bool bVar2;
  char *tokens [1];
  string extension;
  
  BaseImporter::GetExtension(&extension,pFile);
  bVar1 = std::operator==(&extension,"ndo");
  bVar2 = true;
  if (!bVar1) {
    if (checkSig) {
      if (pIOHandler == (IOSystem *)0x0) {
        bVar2 = false;
        goto LAB_00436c75;
      }
    }
    else {
      bVar2 = false;
      if ((pIOHandler == (IOSystem *)0x0) || (extension._M_string_length != 0)) goto LAB_00436c75;
    }
    tokens[0] = "nendo";
    bVar2 = BaseImporter::SearchFileHeaderForToken(pIOHandler,pFile,tokens,1,5,false,false);
  }
LAB_00436c75:
  std::__cxx11::string::~string((string *)&extension);
  return bVar2;
}

Assistant:

bool NDOImporter::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool checkSig) const
{
    // check file extension
    const std::string extension = GetExtension(pFile);

    if( extension == "ndo")
        return true;

    if ((checkSig || !extension.length()) && pIOHandler) {
        const char* tokens[] = {"nendo"};
        return SearchFileHeaderForToken(pIOHandler,pFile,tokens,1,5);
    }
    return false;
}